

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O1

civil_lookup * __thiscall
absl::lts_20240722::time_internal::cctz::TimeZoneInfo::MakeTime
          (civil_lookup *__return_storage_ptr__,TimeZoneInfo *this,civil_second *cs)

{
  Transition *pTVar1;
  Transition *pTVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  pointer pTVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar94;
  Transition *pTVar95;
  diff_t dVar96;
  int_least64_t iVar97;
  int_least64_t iVar98;
  detail *pdVar99;
  undefined8 uVar100;
  int iVar101;
  long lVar102;
  ulong uVar103;
  long c4_shift;
  fields fVar104;
  Transition target;
  civil_second local_60;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined8 local_40;
  undefined4 local_38;
  undefined1 local_34;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined6 uVar34;
  undefined6 uVar35;
  undefined6 uVar36;
  undefined6 uVar37;
  undefined6 uVar38;
  undefined6 uVar39;
  undefined6 uVar40;
  undefined6 uVar41;
  undefined6 uVar42;
  undefined6 uVar43;
  undefined1 uVar44;
  undefined1 uVar45;
  undefined1 uVar46;
  undefined1 uVar47;
  undefined1 uVar48;
  undefined1 uVar49;
  undefined1 uVar50;
  undefined1 uVar51;
  undefined1 uVar52;
  undefined1 uVar53;
  undefined5 uVar54;
  undefined5 uVar55;
  undefined5 uVar56;
  undefined5 uVar57;
  undefined5 uVar58;
  undefined5 uVar59;
  undefined5 uVar60;
  undefined5 uVar61;
  undefined5 uVar62;
  undefined5 uVar63;
  undefined1 uVar64;
  undefined1 uVar65;
  undefined1 uVar66;
  undefined1 uVar67;
  undefined1 uVar68;
  undefined1 uVar69;
  undefined1 uVar70;
  undefined1 uVar71;
  undefined1 uVar72;
  undefined1 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined3 uVar84;
  undefined3 uVar85;
  undefined3 uVar86;
  undefined3 uVar87;
  undefined3 uVar88;
  undefined3 uVar89;
  undefined3 uVar90;
  undefined3 uVar91;
  undefined3 uVar92;
  undefined3 uVar93;
  
  pTVar1 = (this->transitions_).
           super__Vector_base<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->transitions_).
           super__Vector_base<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar102 = (long)pTVar2 - (long)pTVar1;
  if (lVar102 == 0) {
    __assert_fail("timecnt != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc"
                  ,0x39f,
                  "virtual time_zone::civil_lookup absl::time_internal::cctz::TimeZoneInfo::MakeTime(const civil_second &) const"
                 );
  }
  bVar94 = detail::operator<(cs,&pTVar1->civil_sec);
  pTVar95 = pTVar1;
  if (!bVar94) {
    bVar94 = detail::operator<(cs,(civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>
                                   *)((long)(this->transitions_).
                                            super__Vector_base<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                     lVar102 + -0x20));
    pTVar95 = (Transition *)(lVar102 + (long)pTVar1);
    if (bVar94) {
      uVar103 = (this->time_local_hint_).super___atomic_base<unsigned_long>._M_i;
      pTVar95 = (Transition *)0x0;
      if ((uVar103 != 0) &&
         (uVar103 < (ulong)(((long)pTVar2 - (long)pTVar1 >> 4) * -0x5555555555555555))) {
        bVar94 = detail::operator<(cs,&(this->transitions_).
                                       super__Vector_base<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar103 - 1].
                                       civil_sec);
        if (bVar94) {
          pTVar95 = (Transition *)0x0;
        }
        else {
          bVar94 = detail::operator<(cs,&(this->transitions_).
                                         super__Vector_base<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar103].
                                         civil_sec);
          pTVar95 = (Transition *)0x0;
          if (bVar94) {
            pTVar95 = pTVar1 + uVar103;
          }
        }
      }
      if (pTVar95 == (Transition *)0x0) {
        local_60.f_.y = 0;
        local_60.f_._8_8_ = local_60.f_._8_8_ & 0xffffffffffffff00;
        local_50 = (undefined4)(cs->f_).y;
        uStack_4c = *(undefined4 *)((long)&(cs->f_).y + 4);
        uStack_48._0_1_ = (cs->f_).m;
        uStack_48._1_1_ = (cs->f_).d;
        uStack_48._2_1_ = (cs->f_).hh;
        uStack_48._3_1_ = (cs->f_).mm;
        uStack_44 = *(undefined4 *)&(cs->f_).ss;
        local_40 = 0x7b2;
        local_38 = 0x101;
        local_34 = 0;
        pTVar95 = std::
                  __upper_bound<absl::lts_20240722::time_internal::cctz::Transition_const*,absl::lts_20240722::time_internal::cctz::Transition,__gnu_cxx::__ops::_Val_comp_iter<absl::lts_20240722::time_internal::cctz::Transition::ByCivilTime>>
                            (pTVar1,(Transition *)(lVar102 + (long)pTVar1));
        (this->time_local_hint_).super___atomic_base<unsigned_long>._M_i =
             ((long)pTVar95 - (long)pTVar1 >> 4) * -0x5555555555555555;
      }
    }
  }
  if (pTVar95 != pTVar1) {
    if (pTVar95 == pTVar2) {
      bVar94 = detail::operator<(&pTVar95[-1].prev_civil_sec,cs);
      if (bVar94) {
        if (this->extended_ == true) {
          lVar102 = (cs->f_).y;
          if (this->last_year_ < lVar102) {
            c4_shift = (~this->last_year_ + lVar102) / 400 + 1;
            fVar104 = detail::impl::n_sec(c4_shift * -400 + lVar102,(long)(cs->f_).m,
                                          (long)(cs->f_).d,(long)(cs->f_).hh,(long)(cs->f_).mm,
                                          (long)(cs->f_).ss);
            local_60.f_.y = fVar104.y;
            local_60.f_._8_8_ = fVar104._8_8_ & 0xffffffffff;
            TimeLocal(__return_storage_ptr__,this,&local_60,c4_shift);
            return __return_storage_ptr__;
          }
        }
        bVar94 = detail::operator<((civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>
                                    *)((long)&(((this->transition_types_).
                                                super__Vector_base<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              civil_max).f_.y +
                                      (ulong)((uint)pTVar95[-1].type_index * 0x30)),cs);
        if (bVar94) {
          (__return_storage_ptr__->pre).__d.__r = 0;
          (__return_storage_ptr__->trans).__d.__r = 0;
          __return_storage_ptr__->kind = UNIQUE;
          lVar102 = 0x7fffffffffffffff;
          goto LAB_001100fc;
        }
LAB_001100b0:
        uVar12._0_1_ = (cs->f_).m;
        uVar22 = (cs->f_).d;
        uVar32 = (cs->f_).hh;
        uVar52 = (cs->f_).mm;
        uVar72 = (cs->f_).ss;
        uVar92 = *(undefined3 *)&(cs->f_).field_0xd;
        uVar82 = CONCAT31(uVar92,uVar72);
        uVar62 = CONCAT41(uVar82,uVar52);
        uVar42 = CONCAT51(uVar62,uVar32);
        uVar12._1_7_ = CONCAT61(uVar42,uVar22);
        lVar102 = pTVar95[-1].unix_time;
        uVar13._0_1_ = pTVar95[-1].civil_sec.f_.m;
        uVar23 = pTVar95[-1].civil_sec.f_.d;
        uVar33 = pTVar95[-1].civil_sec.f_.hh;
        uVar53 = pTVar95[-1].civil_sec.f_.mm;
        uVar73 = pTVar95[-1].civil_sec.f_.ss;
        uVar93 = *(undefined3 *)&pTVar95[-1].civil_sec.f_.field_0xd;
        uVar83 = CONCAT31(uVar93,uVar73);
        uVar63 = CONCAT41(uVar83,uVar53);
        uVar43 = CONCAT51(uVar63,uVar33);
        uVar13._1_7_ = CONCAT61(uVar43,uVar23);
        dVar96 = detail::difference((detail *)(cs->f_).y,uVar12,pTVar95[-1].civil_sec.f_.y,uVar13);
        iVar101 = ((int)uVar12._1_7_ >> 0x18) - ((int)uVar13._1_7_ >> 0x18);
        lVar102 = dVar96 * 0x3c + lVar102;
        goto LAB_001100eb;
      }
    }
    else {
      bVar94 = detail::operator<(&pTVar95->prev_civil_sec,cs);
      if (bVar94) {
        (__return_storage_ptr__->pre).__d.__r = 0;
        (__return_storage_ptr__->trans).__d.__r = 0;
        (__return_storage_ptr__->post).__d.__r = 0;
        __return_storage_ptr__->kind = SKIPPED;
        pdVar99 = (detail *)(cs->f_).y;
        uVar100._0_1_ = (cs->f_).m;
        uVar100._1_1_ = (cs->f_).d;
        uVar100._2_1_ = (cs->f_).hh;
        uVar100._3_1_ = (cs->f_).mm;
        uVar100._4_1_ = (cs->f_).ss;
        uVar100._5_3_ = *(undefined3 *)&(cs->f_).field_0xd;
        iVar98 = pTVar95->unix_time;
        iVar97 = (pTVar95->prev_civil_sec).f_.y;
        goto LAB_0010fded;
      }
      bVar94 = detail::operator<(&pTVar95[-1].prev_civil_sec,cs);
      if (bVar94) goto LAB_001100b0;
    }
    (__return_storage_ptr__->pre).__d.__r = 0;
    (__return_storage_ptr__->trans).__d.__r = 0;
    (__return_storage_ptr__->post).__d.__r = 0;
    __return_storage_ptr__->kind = REPEATED;
    lVar102 = pTVar95[-1].unix_time;
    uVar6._0_1_ = pTVar95[-1].prev_civil_sec.f_.m;
    uVar17 = pTVar95[-1].prev_civil_sec.f_.d;
    uVar27 = pTVar95[-1].prev_civil_sec.f_.hh;
    uVar47 = pTVar95[-1].prev_civil_sec.f_.mm;
    uVar67 = pTVar95[-1].prev_civil_sec.f_.ss;
    uVar87 = *(undefined3 *)&pTVar95[-1].prev_civil_sec.f_.field_0xd;
    uVar77 = CONCAT31(uVar87,uVar67);
    uVar57 = CONCAT41(uVar77,uVar47);
    uVar37 = CONCAT51(uVar57,uVar27);
    uVar6._1_7_ = CONCAT61(uVar37,uVar17);
    uVar7._0_1_ = (cs->f_).m;
    uVar18 = (cs->f_).d;
    uVar28 = (cs->f_).hh;
    uVar48 = (cs->f_).mm;
    uVar68 = (cs->f_).ss;
    uVar88 = *(undefined3 *)&(cs->f_).field_0xd;
    uVar78 = CONCAT31(uVar88,uVar68);
    uVar58 = CONCAT41(uVar78,uVar48);
    uVar38 = CONCAT51(uVar58,uVar28);
    uVar7._1_7_ = CONCAT61(uVar38,uVar18);
    dVar96 = detail::difference((detail *)pTVar95[-1].prev_civil_sec.f_.y,uVar6,(cs->f_).y,uVar7);
    (__return_storage_ptr__->pre).__d.__r =
         ~(dVar96 * 0x3c + (long)(((int)uVar6._1_7_ >> 0x18) - ((int)uVar7._1_7_ >> 0x18))) +
         lVar102;
    iVar98 = pTVar95[-1].unix_time;
    (__return_storage_ptr__->trans).__d.__r = iVar98;
    uVar8._0_1_ = (cs->f_).m;
    uVar19 = (cs->f_).d;
    uVar29 = (cs->f_).hh;
    uVar49 = (cs->f_).mm;
    uVar69 = (cs->f_).ss;
    uVar89 = *(undefined3 *)&(cs->f_).field_0xd;
    uVar79 = CONCAT31(uVar89,uVar69);
    uVar59 = CONCAT41(uVar79,uVar49);
    uVar39 = CONCAT51(uVar59,uVar29);
    uVar8._1_7_ = CONCAT61(uVar39,uVar19);
    uVar9._0_1_ = pTVar95[-1].civil_sec.f_.m;
    uVar20 = pTVar95[-1].civil_sec.f_.d;
    uVar30 = pTVar95[-1].civil_sec.f_.hh;
    uVar50 = pTVar95[-1].civil_sec.f_.mm;
    uVar70 = pTVar95[-1].civil_sec.f_.ss;
    uVar90 = *(undefined3 *)&pTVar95[-1].civil_sec.f_.field_0xd;
    uVar80 = CONCAT31(uVar90,uVar70);
    uVar60 = CONCAT41(uVar80,uVar50);
    uVar40 = CONCAT51(uVar60,uVar30);
    uVar9._1_7_ = CONCAT61(uVar40,uVar20);
    dVar96 = detail::difference((detail *)(cs->f_).y,uVar8,pTVar95[-1].civil_sec.f_.y,uVar9);
    iVar101 = ((int)uVar8._1_7_ >> 0x18) - ((int)uVar9._1_7_ >> 0x18);
    lVar102 = dVar96 * 0x3c;
LAB_0010ffc4:
    (__return_storage_ptr__->post).__d.__r = lVar102 + iVar98 + (long)iVar101;
    return __return_storage_ptr__;
  }
  bVar94 = detail::operator<(&pTVar95->prev_civil_sec,cs);
  if (bVar94) {
    (__return_storage_ptr__->pre).__d.__r = 0;
    (__return_storage_ptr__->trans).__d.__r = 0;
    (__return_storage_ptr__->post).__d.__r = 0;
    __return_storage_ptr__->kind = SKIPPED;
    pdVar99 = (detail *)(cs->f_).y;
    uVar100._0_1_ = (cs->f_).m;
    uVar100._1_1_ = (cs->f_).d;
    uVar100._2_1_ = (cs->f_).hh;
    uVar100._3_1_ = (cs->f_).mm;
    uVar100._4_1_ = (cs->f_).ss;
    uVar100._5_3_ = *(undefined3 *)&(cs->f_).field_0xd;
    iVar98 = pTVar95->unix_time;
    iVar97 = (pTVar95->prev_civil_sec).f_.y;
LAB_0010fded:
    uVar3._0_1_ = (pTVar95->prev_civil_sec).f_.m;
    uVar14 = (pTVar95->prev_civil_sec).f_.d;
    uVar24 = (pTVar95->prev_civil_sec).f_.hh;
    uVar44 = (pTVar95->prev_civil_sec).f_.mm;
    uVar64 = (pTVar95->prev_civil_sec).f_.ss;
    uVar84 = *(undefined3 *)&(pTVar95->prev_civil_sec).f_.field_0xd;
    uVar74 = CONCAT31(uVar84,uVar64);
    uVar54 = CONCAT41(uVar74,uVar44);
    uVar34 = CONCAT51(uVar54,uVar24);
    uVar3._1_7_ = CONCAT61(uVar34,uVar14);
    dVar96 = detail::difference(pdVar99,uVar100,iVar97,uVar3);
    (__return_storage_ptr__->pre).__d.__r =
         dVar96 * 0x3c + iVar98 +
         (long)(((int)((ulong)uVar100 >> 8) >> 0x18) - ((int)uVar3._1_7_ >> 0x18)) + -1;
    iVar98 = pTVar95->unix_time;
    (__return_storage_ptr__->trans).__d.__r = iVar98;
    uVar4._0_1_ = (pTVar95->civil_sec).f_.m;
    uVar15 = (pTVar95->civil_sec).f_.d;
    uVar25 = (pTVar95->civil_sec).f_.hh;
    uVar45 = (pTVar95->civil_sec).f_.mm;
    uVar65 = (pTVar95->civil_sec).f_.ss;
    uVar85 = *(undefined3 *)&(pTVar95->civil_sec).f_.field_0xd;
    uVar75 = CONCAT31(uVar85,uVar65);
    uVar55 = CONCAT41(uVar75,uVar45);
    uVar35 = CONCAT51(uVar55,uVar25);
    uVar4._1_7_ = CONCAT61(uVar35,uVar15);
    uVar5._0_1_ = (cs->f_).m;
    uVar16 = (cs->f_).d;
    uVar26 = (cs->f_).hh;
    uVar46 = (cs->f_).mm;
    uVar66 = (cs->f_).ss;
    uVar86 = *(undefined3 *)&(cs->f_).field_0xd;
    uVar76 = CONCAT31(uVar86,uVar66);
    uVar56 = CONCAT41(uVar76,uVar46);
    uVar36 = CONCAT51(uVar56,uVar26);
    uVar5._1_7_ = CONCAT61(uVar36,uVar16);
    dVar96 = detail::difference((detail *)(pTVar95->civil_sec).f_.y,uVar4,(cs->f_).y,uVar5);
    iVar101 = ((int)uVar5._1_7_ >> 0x18) - ((int)uVar4._1_7_ >> 0x18);
    lVar102 = dVar96 * -0x3c;
    goto LAB_0010ffc4;
  }
  pTVar10 = (this->transition_types_).
            super__Vector_base<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar103 = (ulong)((uint)this->default_transition_type_ * 0x30);
  bVar94 = detail::operator<(cs,(civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>
                                 *)((long)&(pTVar10->civil_min).f_.y + uVar103));
  if (bVar94) {
    (__return_storage_ptr__->pre).__d.__r = 0;
    (__return_storage_ptr__->trans).__d.__r = 0;
    __return_storage_ptr__->kind = UNIQUE;
    lVar102 = -0x8000000000000000;
    goto LAB_001100fc;
  }
  pdVar99 = (detail *)(cs->f_).y;
  uVar11._0_1_ = (cs->f_).m;
  uVar21 = (cs->f_).d;
  uVar31 = (cs->f_).hh;
  uVar51 = (cs->f_).mm;
  uVar71 = (cs->f_).ss;
  uVar91 = *(undefined3 *)&(cs->f_).field_0xd;
  uVar81 = CONCAT31(uVar91,uVar71);
  uVar61 = CONCAT41(uVar81,uVar51);
  uVar41 = CONCAT51(uVar61,uVar31);
  uVar11._1_7_ = CONCAT61(uVar41,uVar21);
  fVar104 = detail::step(0x7b2,0x101,(long)*(int *)((long)&pTVar10->utc_offset + uVar103));
  dVar96 = detail::difference(pdVar99,uVar11,fVar104.y,fVar104._8_8_ & 0xffffffffff);
  iVar101 = ((int)uVar11._1_7_ >> 0x18) - (fVar104._9_4_ >> 0x18);
  lVar102 = dVar96 * 0x3c;
LAB_001100eb:
  lVar102 = lVar102 + iVar101;
  (__return_storage_ptr__->pre).__d.__r = 0;
  (__return_storage_ptr__->trans).__d.__r = 0;
  __return_storage_ptr__->kind = UNIQUE;
LAB_001100fc:
  (__return_storage_ptr__->post).__d.__r = lVar102;
  (__return_storage_ptr__->trans).__d.__r = lVar102;
  (__return_storage_ptr__->pre).__d.__r = lVar102;
  return __return_storage_ptr__;
}

Assistant:

time_zone::civil_lookup TimeZoneInfo::MakeTime(const civil_second& cs) const {
  const std::size_t timecnt = transitions_.size();
  assert(timecnt != 0);  // We always add a transition.

  // Find the first transition after our target civil time.
  const Transition* tr = nullptr;
  const Transition* begin = &transitions_[0];
  const Transition* end = begin + timecnt;
  if (cs < begin->civil_sec) {
    tr = begin;
  } else if (cs >= transitions_[timecnt - 1].civil_sec) {
    tr = end;
  } else {
    const std::size_t hint = time_local_hint_.load(std::memory_order_relaxed);
    if (0 < hint && hint < timecnt) {
      if (transitions_[hint - 1].civil_sec <= cs) {
        if (cs < transitions_[hint].civil_sec) {
          tr = begin + hint;
        }
      }
    }
    if (tr == nullptr) {
      const Transition target = {0, 0, cs, civil_second()};
      tr = std::upper_bound(begin, end, target, Transition::ByCivilTime());
      time_local_hint_.store(static_cast<std::size_t>(tr - begin),
                             std::memory_order_relaxed);
    }
  }

  if (tr == begin) {
    if (tr->prev_civil_sec >= cs) {
      // Before first transition, so use the default offset.
      const TransitionType& tt(transition_types_[default_transition_type_]);
      if (cs < tt.civil_min) return MakeUnique(time_point<seconds>::min());
      return MakeUnique(cs - (civil_second() + tt.utc_offset));
    }
    // tr->prev_civil_sec < cs < tr->civil_sec
    return MakeSkipped(*tr, cs);
  }

  if (tr == end) {
    if (cs > (--tr)->prev_civil_sec) {
      // After the last transition. If we extended the transitions using
      // future_spec_, shift back to a supported year using the 400-year
      // cycle of calendaric equivalence and then compensate accordingly.
      if (extended_ && cs.year() > last_year_) {
        const year_t shift = (cs.year() - last_year_ - 1) / 400 + 1;
        return TimeLocal(YearShift(cs, shift * -400), shift);
      }
      const TransitionType& tt(transition_types_[tr->type_index]);
      if (cs > tt.civil_max) return MakeUnique(time_point<seconds>::max());
      return MakeUnique(tr->unix_time + (cs - tr->civil_sec));
    }
    // tr->civil_sec <= cs <= tr->prev_civil_sec
    return MakeRepeated(*tr, cs);
  }

  if (tr->prev_civil_sec < cs) {
    // tr->prev_civil_sec < cs < tr->civil_sec
    return MakeSkipped(*tr, cs);
  }

  if (cs <= (--tr)->prev_civil_sec) {
    // tr->civil_sec <= cs <= tr->prev_civil_sec
    return MakeRepeated(*tr, cs);
  }

  // In between transitions.
  return MakeUnique(tr->unix_time + (cs - tr->civil_sec));
}